

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::repeated(QString *__return_storage_ptr__,QString *this,qsizetype times)

{
  Data *pDVar1;
  char16_t *__old_val;
  long lVar2;
  size_t sVar3;
  longlong __old_val_1;
  long lVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->d).size;
  if (lVar4 != 0) {
    if (1 < times) {
      lVar4 = lVar4 * times;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      reserve((QString *)&local_58,lVar4);
      if (local_58.d == (Data *)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = ((local_58.d)->super_QArrayData).alloc;
      }
      if (lVar2 == lVar4) {
        memcpy(local_58.ptr,(this->d).ptr,(this->d).size * 2);
        sVar3 = (this->d).size;
        pcVar5 = local_58.ptr + sVar3;
        while ((long)sVar3 <= lVar4 >> 1) {
          memcpy(pcVar5,local_58.ptr,sVar3 * 2);
          pcVar5 = pcVar5 + sVar3;
          sVar3 = sVar3 * 2;
        }
        memcpy(pcVar5,local_58.ptr,(lVar4 - sVar3) * 2);
        pcVar5 = local_58.ptr;
        pDVar1 = local_58.d;
        local_58.ptr[lVar4] = L'\0';
        local_58.d = (Data *)0x0;
        (__return_storage_ptr__->d).d = pDVar1;
        local_58.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).ptr = pcVar5;
        local_58.size = 0;
        (__return_storage_ptr__->d).size = lVar4;
      }
      else {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_002f6477;
    }
    if (times != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_002f6477;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
    return __return_storage_ptr__;
  }
LAB_002f6477:
  __stack_chk_fail();
}

Assistant:

QString QString::repeated(qsizetype times) const
{
    if (d.size == 0)
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QString();
    }

    const qsizetype resultSize = times * d.size;

    QString result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QString(); // not enough memory

    memcpy(result.d.data(), d.data(), d.size * sizeof(QChar));

    qsizetype sizeSoFar = d.size;
    char16_t *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar * sizeof(QChar));
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), (resultSize - sizeSoFar) * sizeof(QChar));
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}